

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImGui::CalcTypematicRepeatAmount(float t0,float t1,float repeat_delay,float repeat_rate)

{
  float in_XMM0_Db;
  int iVar1;
  float in_XMM1_Db;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  if ((t1 == 0.0) && (!NAN(t1))) {
    return 1;
  }
  iVar1 = 0;
  if (t0 < t1) {
    if (repeat_rate <= 0.0) {
      return -(uint)(repeat_delay <= t1 && t0 < repeat_delay) & 1;
    }
    auVar2._0_4_ = t1 - repeat_delay;
    auVar2._4_4_ = t0 - repeat_delay;
    auVar2._8_4_ = in_XMM1_Db - repeat_delay;
    auVar2._12_4_ = in_XMM0_Db - repeat_delay;
    auVar3._4_4_ = repeat_rate;
    auVar3._0_4_ = repeat_rate;
    auVar3._8_4_ = repeat_rate;
    auVar3._12_4_ = repeat_rate;
    auVar3 = divps(auVar2,auVar3);
    iVar1 = ((int)((uint)(t1 < repeat_delay) << 0x1f) >> 0x1f | (int)auVar3._0_4_) -
            ((int)((uint)(t0 < repeat_delay) << 0x1f) >> 0x1f | (int)auVar3._4_4_);
  }
  return iVar1;
}

Assistant:

int ImGui::CalcTypematicRepeatAmount(float t0, float t1, float repeat_delay, float repeat_rate)
{
    if (t1 == 0.0f)
        return 1;
    if (t0 >= t1)
        return 0;
    if (repeat_rate <= 0.0f)
        return (t0 < repeat_delay) && (t1 >= repeat_delay);
    const int count_t0 = (t0 < repeat_delay) ? -1 : (int)((t0 - repeat_delay) / repeat_rate);
    const int count_t1 = (t1 < repeat_delay) ? -1 : (int)((t1 - repeat_delay) / repeat_rate);
    const int count = count_t1 - count_t0;
    return count;
}